

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  GPU_Target *screen;
  int iVar1;
  
  iVar1 = 0;
  screen = GPU_Init(800,600,0);
  if (screen == (GPU_Target *)0x0) {
    iVar1 = -1;
  }
  else {
    main_loop(screen);
    GPU_Quit();
  }
  return iVar1;
}

Assistant:

int main(int argc, char* argv[])
{
	GPU_Target* screen;
	
	screen = GPU_Init(800, 600, GPU_DEFAULT_INIT_FLAGS);
	if(screen == NULL)
		return -1;
	
	main_loop(screen);
	
	GPU_Quit();
	
	return 0;
}